

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::AddProperty
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  int iVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  JavascriptLibrary *library;
  code *pcVar4;
  DictionaryPropertyDescriptor<int> *this_00;
  Var aValue;
  undefined8 this_01;
  bool bVar5;
  bool bVar6;
  PropertyTypes PVar7;
  BOOL BVar8;
  PropertyId propertyId;
  undefined4 *puVar9;
  undefined7 in_register_00000081;
  DynamicObject *pDVar10;
  DictionaryPropertyDescriptor<int> *local_80;
  DictionaryPropertyDescriptor<int> *descriptor;
  int local_6c;
  Var local_68;
  PropertyValueInfo *local_60;
  undefined1 local_58 [8];
  DictionaryPropertyDescriptor<int> newDescriptor;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord_local;
  
  propertyRecord_local._0_4_ = (uint)CONCAT71(in_register_00000081,attributes);
  local_60 = info;
  local_40 = propertyRecord;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar5) goto LAB_00db5326;
    *puVar9 = 0;
  }
  newDescriptor._8_8_ =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord_local._4_4_ = local_40->pid;
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&local_80,(int *)local_58);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar5) goto LAB_00db5326;
    *puVar9 = 0;
  }
  if (local_40->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar5) goto LAB_00db5326;
    *puVar9 = 0;
  }
  local_68 = value;
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar5 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,(ScriptContext *)newDescriptor._8_8_,
                         throwIfNotExtensible), !bVar5)) {
    return 0;
  }
  iVar2 = (this->super_DynamicTypeHandler).slotCapacity;
  if (iVar2 <= this->nextPropertyIndex) {
    if (0x3ffffffe < iVar2) {
      Throw::OutOfMemory();
    }
    EnsureSlotCapacity(this,instance,1);
  }
  iVar2 = this->nextPropertyIndex;
  if (SCARRY4(iVar2,1)) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = iVar2 + 1;
  local_58[0] = PreventFalseReference;
  local_58[1] = (PropertyAttributes)(uint)propertyRecord_local;
  newDescriptor.flags = ~None;
  newDescriptor.Attributes = 0xff;
  newDescriptor._2_2_ = 0xffff;
  newDescriptor.Data = -1;
  local_58._4_4_ = iVar2;
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar5) goto LAB_00db5326;
    *puVar9 = 0;
  }
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pDVar10 = (DynamicObject *)0x0;
  }
  else {
    pDVar10 = (DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef;
  }
  local_6c = iVar2;
  if (pDVar10 != instance && pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x887,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar5) goto LAB_00db5326;
    *puVar9 = 0;
  }
  aValue = local_68;
  if ((((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
      (local_58[0] = local_58[0] | IsInitialized, pDVar10 == instance)) &&
     ((flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
      PropertyOperation_None && 0xf < propertyRecord_local._4_4_)) {
    if (local_68 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x88f,"(value != nullptr)","value != nullptr");
      if (!bVar5) goto LAB_00db5326;
      *puVar9 = 0;
    }
    BVar8 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
    if (BVar8 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
      if (!bVar5) {
LAB_00db5326:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    bVar5 = VarIs<Js::JavascriptFunction>(aValue);
    if (bVar5) {
      bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
      bVar6 = !bVar6;
    }
    else {
      bVar5 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
      bVar6 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_40,aValue);
      bVar6 = bVar6 && !bVar5;
    }
    local_58[0] = bVar6 << 5 | local_58[0] & ~IsFixed;
  }
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_40,(DictionaryPropertyDescriptor<int> *)local_58);
  if (((uint)propertyRecord_local & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  library = *(JavascriptLibrary **)(newDescriptor._8_8_ + 8);
  Memory::Recycler::WBSetBit((char *)&descriptor);
  descriptor = (DictionaryPropertyDescriptor<int> *)
               &library->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
  this_00 = descriptor;
  if ((((uint)propertyRecord_local & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_01 = newDescriptor._8_8_, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId
                           ((ScriptContext *)newDescriptor._8_8_,propertyRecord_local._4_4_);
    ScriptContext::InvalidateStoreFieldCaches((ScriptContext *)this_01,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_00);
  }
  bVar5 = NoSpecialPropertyCache::IsSpecialProperty(propertyRecord_local._4_4_);
  iVar2 = local_6c;
  if ((bVar5) &&
     (PVar7 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler),
     -1 < (char)PVar7)) {
    bVar5 = NoSpecialPropertyCache::IsDefaultSpecialProperty
                      (instance,library,propertyRecord_local._4_4_);
    if (bVar5) {
      if (local_60 != (PropertyValueInfo *)0x0) {
        local_60->m_instance = &instance->super_RecyclableObject;
        local_60->m_propertyIndex = 0xffff;
        local_60->m_attributes = '\0';
        local_60->flags = InlineCacheNoFlags;
      }
    }
    else {
      pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes;
      *pTVar1 = *pTVar1 | 0x80;
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        Memory::Recycler::WBSetBit((char *)&descriptor);
        descriptor = (DictionaryPropertyDescriptor<int> *)
                     &library->typesWithNoSpecialPropertyProtoChain;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&descriptor);
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
                  ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)descriptor);
      }
    }
  }
  DynamicTypeHandler::SetSlotUnchecked(instance,iVar2,local_68);
  if (local_60 != (PropertyValueInfo *)0x0) {
    local_60->m_instance = &instance->super_RecyclableObject;
    local_60->m_propertyIndex = 0xffff;
    local_60->m_attributes = '\0';
    local_60->flags = InlineCacheNoFlags;
  }
  ScriptContext::InvalidateProtoCaches((ScriptContext *)newDescriptor._8_8_,local_40->pid);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,local_40->pid,local_68,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }